

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int all_bytes_equal(void *s,uchar value,size_t n)

{
  size_t i;
  uchar *p;
  size_t n_local;
  uchar value_local;
  void *s_local;
  
  i = 0;
  while( true ) {
    if (n <= i) {
      return 1;
    }
    if (*(uchar *)((long)s + i) != value) break;
    i = i + 1;
  }
  return 0;
}

Assistant:

static int all_bytes_equal(const void* s, unsigned char value, size_t n) {
    const unsigned char *p = s;
    size_t i;

    for (i = 0; i < n; i++) {
        if (p[i] != value) {
            return 0;
        }
    }
    return 1;
}